

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O2

string * __thiscall
cmCryptoHash::FinalizeHex_abi_cxx11_(string *__return_storage_ptr__,cmCryptoHash *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  Finalize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,this);
  ByteHashToString_abi_cxx11_(__return_storage_ptr__,(cmCryptoHash *)&_Stack_28,hash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::FinalizeHex()
{
  return cmCryptoHash::ByteHashToString(this->Finalize());
}